

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall
sf::priv::GlxContext::createSurface
          (GlxContext *this,GlxContext *shared,uint width,uint height,uint bitsPerPixel)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  XSetWindowAttributes attributes;
  int screen;
  int attributes_1 [6];
  XVisualInfo *visual;
  int i;
  GLXFBConfig *configs;
  int nbConfigs;
  GLXFBConfig *config;
  bool hasCreatePbuffer;
  int minor;
  int major;
  XVisualInfo visualInfo;
  XVisualInfo *in_stack_fffffffffffffea8;
  GlxContext *in_stack_fffffffffffffeb0;
  bool local_139;
  undefined1 local_130 [64];
  ContextSettings *in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff1c;
  Display *in_stack_ffffffffffffff20;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  GlxContext *in_stack_ffffffffffffff60;
  int local_8c;
  int local_7c;
  undefined8 *local_78;
  bool local_69;
  int local_68;
  int local_64;
  undefined8 local_60;
  long local_58;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  selectBestVisual(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10);
  if ((local_10 != 0) && (sfglx_ext_SGIX_pbuffer == 1)) {
    local_64 = 0;
    local_68 = 0;
    glXQueryVersion(*(undefined8 *)(in_RDI + 0x30),&local_64,&local_68);
    local_139 = 1 < local_64 || 2 < local_68;
    local_69 = local_139;
    if (1 < local_64 || 2 < local_68) {
      local_78 = (undefined8 *)0x0;
      local_7c = 0;
      lVar2 = glXChooseFBConfig(*(undefined8 *)(in_RDI + 0x30),
                                *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0xe0),0,&local_7c);
      for (local_8c = 0; lVar2 != 0 && local_8c < local_7c; local_8c = local_8c + 1) {
        lVar3 = glXGetVisualFromFBConfig
                          (*(undefined8 *)(in_RDI + 0x30),
                           *(undefined8 *)(lVar2 + (long)local_8c * 8));
        if (lVar3 != 0) {
          if (*(long *)(lVar3 + 8) == local_58) {
            local_78 = (undefined8 *)(lVar2 + (long)local_8c * 8);
            XFree(lVar3);
            break;
          }
          XFree(lVar3);
        }
      }
      if (local_78 != (undefined8 *)0x0) {
        local_b8 = 0x8041;
        local_b4 = local_14;
        local_b0 = 0x8040;
        local_ac = local_18;
        local_a8 = 0;
        local_a4 = 0;
        uVar4 = glXCreatePbuffer(*(undefined8 *)(in_RDI + 0x30),*local_78,&local_b8);
        *(undefined8 *)(in_RDI + 0x48) = uVar4;
        updateSettingsFromVisualInfo(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        XFree(lVar2);
        return;
      }
      if (lVar2 != 0) {
        XFree(lVar2);
      }
    }
  }
  iVar1 = *(int *)(*(long *)(in_RDI + 0x30) + 0xe0);
  XCreateColormap(*(undefined8 *)(in_RDI + 0x30),
                  *(undefined8 *)
                   (*(long *)(*(long *)(in_RDI + 0x30) + 0xe8) + (long)iVar1 * 0x80 + 0x10),local_60
                  ,0);
  uVar4 = XCreateWindow(*(undefined8 *)(in_RDI + 0x30),
                        *(undefined8 *)
                         (*(long *)(*(long *)(in_RDI + 0x30) + 0xe8) + (long)iVar1 * 0x80 + 0x10),0,
                        0,local_14,local_18,0,
                        *(undefined4 *)
                         (*(long *)(*(long *)(in_RDI + 0x30) + 0xe8) + (long)iVar1 * 0x80 + 0x38),1,
                        local_60,0x2000,local_130);
  *(undefined8 *)(in_RDI + 0x38) = uVar4;
  *(undefined1 *)(in_RDI + 0x50) = 1;
  updateSettingsFromWindow(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void GlxContext::createSurface(GlxContext* shared, unsigned int width, unsigned int height, unsigned int bitsPerPixel)
{
    // Choose the visual according to the context settings
    XVisualInfo visualInfo = selectBestVisual(m_display, bitsPerPixel, m_settings);

    // Check if the shared context already exists and pbuffers are supported
    if (shared && (sfglx_ext_SGIX_pbuffer == sfglx_LOAD_SUCCEEDED))
    {
        // There are no GLX versions prior to 1.0
        int major = 0;
        int minor = 0;

        glXQueryVersion(m_display, &major, &minor);

        // Check if glXCreatePbuffer is available (requires GLX 1.3 or greater)
        bool hasCreatePbuffer = ((major > 1) || (minor >= 3));

        if (hasCreatePbuffer)
        {
            // Get a GLXFBConfig that matches the visual
            GLXFBConfig* config = NULL;

            // We don't supply attributes to match against, since
            // the visual we are matching against was already
            // deemed suitable in selectBestVisual()
            int nbConfigs = 0;
            GLXFBConfig* configs = glXChooseFBConfig(m_display, DefaultScreen(m_display), NULL, &nbConfigs);

            for (int i = 0; configs && (i < nbConfigs); ++i)
            {
                XVisualInfo* visual = glXGetVisualFromFBConfig(m_display, configs[i]);

                if (!visual)
                    continue;

                if (visual->visualid == visualInfo.visualid)
                {
                    config = &configs[i];
                    XFree(visual);
                    break;
                }

                XFree(visual);
            }

            if (config)
            {
                int attributes[] =
                {
                    GLX_PBUFFER_WIDTH,  static_cast<int>(width),
                    GLX_PBUFFER_HEIGHT, static_cast<int>(height),
                    0,                  0
                };

                m_pbuffer = glXCreatePbuffer(m_display, *config, attributes);

                updateSettingsFromVisualInfo(&visualInfo);

                XFree(configs);

                return;
            }

            if (configs)
                XFree(configs);
        }
    }

    // If pbuffers are not available we use a hidden window as the off-screen surface to draw to
    int screen = DefaultScreen(m_display);

    // Define the window attributes
    XSetWindowAttributes attributes;
    attributes.colormap = XCreateColormap(m_display, RootWindow(m_display, screen), visualInfo.visual, AllocNone);

    m_window = XCreateWindow(m_display,
                             RootWindow(m_display, screen),
                             0, 0,
                             width, height,
                             0,
                             DefaultDepth(m_display, screen),
                             InputOutput,
                             visualInfo.visual,
                             CWColormap,
                             &attributes);

    m_ownsWindow = true;

    updateSettingsFromWindow();
}